

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

void __thiscall ZippedFile::ZippedFile(ZippedFile *this,ITypeManager *type_manager,string *file)

{
  (this->super_IContainedElement).type_manager_ = type_manager;
  (this->super_IContainedElement)._vptr_IContainedElement = (_func_int **)&PTR__ZippedFile_0018e048;
  std::__cxx11::string::string((string *)&this->file_name_,(string *)file);
  NodeFS::NodeFS(&this->zip_file_);
  InitUnzip(this);
  return;
}

Assistant:

ZippedFile::ZippedFile(ITypeManager* type_manager, const std::string& file) : IContainedElement(type_manager),
                                                                              file_name_(file)
{
   // Unzip to file
   InitUnzip();
}